

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlAttrHashInsert(xmlParserCtxtPtr ctxt,uint size,xmlChar *name,xmlChar *uri,uint hashValue,
                     int aindex)

{
  int iVar1;
  int iVar2;
  xmlChar *pxVar3;
  long lVar4;
  xmlAttrHashBucket *pxVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar7 = (ulong)(size - 1 & hashValue);
  pxVar5 = ctxt->attrHash + uVar7;
  do {
    iVar1 = pxVar5->index;
    lVar4 = (long)iVar1;
    if (lVar4 < 0) {
      pxVar5->index = aindex;
      return 0x7fffffff;
    }
    if (ctxt->atts[lVar4] == name) {
      iVar2 = *(int *)(ctxt->atts + lVar4 + 2);
      if (iVar2 == 0x7ffffffe) {
        pxVar3 = ctxt->str_xml_ns;
      }
      else {
        if (iVar2 == 0x7fffffff) {
          if (uri == (xmlChar *)0x0) {
            return iVar1;
          }
          goto LAB_00141880;
        }
        pxVar3 = ctxt->nsTab[iVar2 * 2 + 1];
      }
      if (pxVar3 == uri) {
        return iVar1;
      }
    }
LAB_00141880:
    uVar6 = (int)uVar7 + 1;
    uVar7 = (ulong)uVar6;
    pxVar5 = pxVar5 + 1;
    if (size <= uVar6) {
      uVar7 = 0;
      pxVar5 = ctxt->attrHash;
    }
  } while( true );
}

Assistant:

static int
xmlAttrHashInsert(xmlParserCtxtPtr ctxt, unsigned size, const xmlChar *name,
                  const xmlChar *uri, unsigned hashValue, int aindex) {
    xmlAttrHashBucket *table = ctxt->attrHash;
    xmlAttrHashBucket *bucket;
    unsigned hindex;

    hindex = hashValue & (size - 1);
    bucket = &table[hindex];

    while (bucket->index >= 0) {
        const xmlChar **atts = &ctxt->atts[bucket->index];

        if (name == atts[0]) {
            int nsIndex = XML_PTR_TO_INT(atts[2]);

            if ((nsIndex == NS_INDEX_EMPTY) ? (uri == NULL) :
                (nsIndex == NS_INDEX_XML) ? (uri == ctxt->str_xml_ns) :
                (uri == ctxt->nsTab[nsIndex * 2 + 1]))
                return(bucket->index);
        }

        hindex++;
        bucket++;
        if (hindex >= size) {
            hindex = 0;
            bucket = table;
        }
    }

    bucket->index = aindex;

    return(INT_MAX);
}